

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O0

void copyBytes(ostream *dst,istream *src,int len)

{
  int *piVar1;
  int in_EDX;
  char *in_RSI;
  char *in_RDI;
  int amt;
  int i;
  char buf [512];
  int BUFLEN;
  int local_224;
  int local_220;
  int local_21c;
  undefined1 local_218 [512];
  int local_18;
  int local_14;
  char *local_10;
  char *local_8;
  
  local_18 = 0x200;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_21c = 0; local_21c < local_14; local_21c = local_21c + 0x200) {
    local_224 = local_14 - local_21c;
    piVar1 = std::min<int>(&local_224,&local_18);
    local_220 = *piVar1;
    std::istream::read(local_10,(long)local_218);
    std::ostream::write(local_8,(long)local_218);
  }
  return;
}

Assistant:

void copyBytes(std::ostream& dst, std::istream& src, int len) {
	constexpr int BUFLEN = 512;
	char buf[BUFLEN];
	for (int i = 0; i < len; i += BUFLEN) {
		int amt = std::min(len - i, BUFLEN);
		src.read(buf, amt);
		dst.write(buf, amt);
	}
}